

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.hpp
# Opt level: O1

void __thiscall
duckdb::ConversionException::ConversionException<long>
          (ConversionException *this,string *msg,long params)

{
  string local_30;
  
  Exception::ConstructMessage<long>(&local_30,msg,params);
  ConversionException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit ConversionException(const string &msg, ARGS... params)
	    : ConversionException(ConstructMessage(msg, params...)) {
	}